

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

bool __thiscall ELFIO::elfio::load_segments(elfio *this,istream *stream,bool is_lazy)

{
  long lVar1;
  istream *piVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  pointer peVar9;
  undefined4 extraout_var;
  segment_impl<ELFIO::Elf64_Phdr> *this_00;
  segment_impl<ELFIO::Elf32_Phdr> *this_01;
  reference this_02;
  pointer psVar10;
  streamoff sVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Elf64_Off seg_end;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  reference this_03;
  pointer psVar12;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  Elf64_Off seg_end_00;
  Elf64_Off EVar13;
  byte local_119;
  segment_impl<ELFIO::Elf32_Phdr> *local_108;
  segment_impl<ELFIO::Elf64_Phdr> *local_f0;
  unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *psec;
  iterator __end3;
  iterator __begin3;
  Sections *__range3;
  Elf64_Off segVEndAddr;
  Elf64_Off segVBaseAddr;
  Elf64_Off segEndOffset;
  Elf64_Off segBaseOffset;
  fpos<__mbstate_t> local_90;
  pointer local_80;
  segment *seg;
  segment_impl<ELFIO::Elf32_Phdr> *local_70;
  segment_impl<ELFIO::Elf32_Phdr> *local_68 [3];
  undefined1 local_49;
  segment_impl<ELFIO::Elf64_Phdr> *local_48;
  segment_impl<ELFIO::Elf64_Phdr> *local_40;
  ushort local_32;
  long lStack_30;
  Elf_Half i;
  Elf64_Off offset;
  Elf_Half num;
  Elf_Half entry_size;
  uchar file_class;
  istream *piStack_20;
  bool is_lazy_local;
  istream *stream_local;
  elfio *this_local;
  
  offset._7_1_ = is_lazy;
  piStack_20 = stream;
  stream_local = (istream *)this;
  peVar9 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator->
                     (&this->header);
  iVar4 = (*peVar9->_vptr_elf_header[4])();
  offset._6_1_ = (char)iVar4;
  peVar9 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator->
                     (&this->header);
  iVar4 = (*peVar9->_vptr_elf_header[9])();
  offset._4_2_ = (ushort)iVar4;
  peVar9 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator->
                     (&this->header);
  iVar4 = (*peVar9->_vptr_elf_header[0x1c])();
  offset._2_2_ = (ushort)iVar4;
  peVar9 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator->
                     (&this->header);
  iVar4 = (*peVar9->_vptr_elf_header[0x1e])();
  lStack_30 = CONCAT44(extraout_var,iVar4);
  if ((((offset._2_2_ == 0) || (offset._6_1_ != '\x02')) || (0x37 < offset._4_2_)) &&
     (((offset._2_2_ == 0 || (offset._6_1_ != '\x01')) || (0x1f < offset._4_2_)))) {
    for (local_32 = 0; local_32 < offset._2_2_; local_32 = local_32 + 1) {
      if (offset._6_1_ == '\x02') {
        this_00 = (segment_impl<ELFIO::Elf64_Phdr> *)operator_new(0x90,(nothrow_t *)&std::nothrow);
        local_49 = 0;
        local_f0 = (segment_impl<ELFIO::Elf64_Phdr> *)0x0;
        if (this_00 != (segment_impl<ELFIO::Elf64_Phdr> *)0x0) {
          local_49 = 1;
          local_48 = this_00;
          segment_impl<ELFIO::Elf64_Phdr>::segment_impl
                    (this_00,&this->convertor,&this->addr_translator);
          local_f0 = this_00;
        }
        local_40 = local_f0;
        std::
        vector<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>,std::allocator<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>>>
        ::emplace_back<ELFIO::segment_impl<ELFIO::Elf64_Phdr>*>
                  ((vector<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>,std::allocator<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>>>
                    *)&this->segments_,&local_40);
      }
      else {
        if (offset._6_1_ != '\x01') {
          std::
          vector<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
          ::pop_back(&this->segments_);
          return false;
        }
        this_01 = (segment_impl<ELFIO::Elf32_Phdr> *)operator_new(0x78,(nothrow_t *)&std::nothrow);
        seg._7_1_ = 0;
        local_108 = (segment_impl<ELFIO::Elf32_Phdr> *)0x0;
        if (this_01 != (segment_impl<ELFIO::Elf32_Phdr> *)0x0) {
          seg._7_1_ = 1;
          local_70 = this_01;
          segment_impl<ELFIO::Elf32_Phdr>::segment_impl
                    (this_01,&this->convertor,&this->addr_translator);
          local_108 = this_01;
        }
        local_68[0] = local_108;
        std::
        vector<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>,std::allocator<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>>>
        ::emplace_back<ELFIO::segment_impl<ELFIO::Elf32_Phdr>*>
                  ((vector<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>,std::allocator<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>>>
                    *)&this->segments_,local_68);
      }
      this_02 = std::
                vector<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                ::back(&this->segments_);
      psVar10 = std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>::get(this_02);
      piVar2 = piStack_20;
      lVar1 = lStack_30;
      local_80 = psVar10;
      std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&segBaseOffset,(ulong)local_32);
      sVar11 = std::fpos::operator_cast_to_long((fpos *)&segBaseOffset);
      std::fpos<__mbstate_t>::fpos(&local_90,lVar1 + sVar11 * (ulong)offset._4_2_);
      uVar5 = (*psVar10->_vptr_segment[0x1c])
                        (psVar10,piVar2,local_90._M_off,local_90._M_state,(ulong)(offset._7_1_ & 1))
      ;
      local_119 = 1;
      if ((uVar5 & 1) != 0) {
        local_119 = std::ios::fail();
      }
      if ((local_119 & 1) != 0) {
        std::
        vector<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
        ::pop_back(&this->segments_);
        return false;
      }
      (*local_80->_vptr_segment[0x1a])(local_80,&local_32);
      iVar4 = (*local_80->_vptr_segment[0x11])();
      iVar6 = (*local_80->_vptr_segment[0xd])();
      seg_end = CONCAT44(extraout_var_00,iVar4) + CONCAT44(extraout_var_01,iVar6);
      iVar6 = (*local_80->_vptr_segment[9])();
      iVar7 = (*local_80->_vptr_segment[0xf])();
      seg_end_00 = CONCAT44(extraout_var_02,iVar6) + CONCAT44(extraout_var_03,iVar7);
      __end3 = Sections::begin(&this->sections);
      psec = (unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *)
             Sections::end(&this->sections);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_*,_std::vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>_>
                                         *)&psec), bVar3) {
        this_03 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_*,_std::vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>_>
                  ::operator*(&__end3);
        psVar12 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::operator->
                            (this_03);
        uVar5 = (*psVar12->_vptr_section[7])();
        if ((uVar5 & 2) == 2) {
          psVar12 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::
                    operator->(this_03);
          iVar7 = (*psVar12->_vptr_section[0x11])();
          psVar12 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::
                    operator->(this_03);
          iVar8 = (*psVar12->_vptr_section[0x13])();
          EVar13 = seg_end_00;
          bVar3 = is_sect_in_seg(CONCAT44(extraout_var_04,iVar7),CONCAT44(extraout_var_05,iVar8),
                                 CONCAT44(extraout_var_02,iVar6),seg_end_00);
          if (bVar3) {
LAB_0011a28f:
            iVar7 = (*local_80->_vptr_segment[3])();
            if (iVar7 == 7) {
              psVar12 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::
                        operator->(this_03);
              uVar5 = (*psVar12->_vptr_section[7])();
              if ((uVar5 & 0x400) != 0x400) goto LAB_0011a32f;
            }
            psVar12 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::
                      operator->(this_03);
            uVar5 = (*psVar12->_vptr_section[7])();
            if (((uVar5 & 0x400) != 0x400) || (iVar7 = (*local_80->_vptr_segment[3])(), iVar7 == 7))
            {
              psVar10 = local_80;
              psVar12 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::
                        operator->(this_03);
              iVar7 = (*psVar12->_vptr_section[2])();
              (*psVar10->_vptr_segment[0x15])
                        (psVar10,(ulong)(ushort)iVar7,0,
                         CONCAT62((int6)(EVar13 >> 0x10),(ushort)iVar7));
            }
          }
        }
        else {
          psVar12 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::
                    operator->(this_03);
          iVar7 = (*psVar12->_vptr_section[0x17])();
          psVar12 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::
                    operator->(this_03);
          iVar8 = (*psVar12->_vptr_section[0x13])();
          EVar13 = seg_end;
          bVar3 = is_sect_in_seg(CONCAT44(extraout_var_06,iVar7),CONCAT44(extraout_var_07,iVar8),
                                 CONCAT44(extraout_var_00,iVar4),seg_end);
          if (bVar3) goto LAB_0011a28f;
        }
LAB_0011a32f:
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_*,_std::vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool load_segments( std::istream& stream, bool is_lazy )
    {
        unsigned char file_class = header->get_class();
        Elf_Half      entry_size = header->get_segment_entry_size();
        Elf_Half      num        = header->get_segments_num();
        Elf64_Off     offset     = header->get_segments_offset();

        if ( ( num != 0 && file_class == ELFCLASS64 &&
               entry_size < sizeof( Elf64_Phdr ) ) ||
             ( num != 0 && file_class == ELFCLASS32 &&
               entry_size < sizeof( Elf32_Phdr ) ) ) {
            return false;
        }

        for ( Elf_Half i = 0; i < num; ++i ) {
            if ( file_class == ELFCLASS64 ) {
                segments_.emplace_back(
                    new ( std::nothrow ) segment_impl<Elf64_Phdr>(
                        &convertor, &addr_translator ) );
            }
            else if ( file_class == ELFCLASS32 ) {
                segments_.emplace_back(
                    new ( std::nothrow ) segment_impl<Elf32_Phdr>(
                        &convertor, &addr_translator ) );
            }
            else {
                segments_.pop_back();
                return false;
            }

            segment* seg = segments_.back().get();

            if ( !seg->load( stream,
                             static_cast<std::streamoff>( offset ) +
                                 static_cast<std::streampos>( i ) * entry_size,
                             is_lazy ) ||
                 stream.fail() ) {
                segments_.pop_back();
                return false;
            }

            seg->set_index( i );

            // Add sections to the segments (similar to readelfs algorithm)
            Elf64_Off segBaseOffset = seg->get_offset();
            Elf64_Off segEndOffset  = segBaseOffset + seg->get_file_size();
            Elf64_Off segVBaseAddr  = seg->get_virtual_address();
            Elf64_Off segVEndAddr   = segVBaseAddr + seg->get_memory_size();
            for ( const auto& psec : sections ) {
                // SHF_ALLOC sections are matched based on the virtual address
                // otherwise the file offset is matched
                if ( ( ( psec->get_flags() & SHF_ALLOC ) == SHF_ALLOC )
                         ? is_sect_in_seg( psec->get_address(),
                                           psec->get_size(), segVBaseAddr,
                                           segVEndAddr )
                         : is_sect_in_seg( psec->get_offset(), psec->get_size(),
                                           segBaseOffset, segEndOffset ) ) {

                    // If it is a TLS segment, add TLS sections only and vice versa
                    if ( ( ( seg->get_type() == PT_TLS ) &&
                           ( ( psec->get_flags() & SHF_TLS ) != SHF_TLS ) ) ||
                         ( ( ( psec->get_flags() & SHF_TLS ) == SHF_TLS ) &&
                           ( seg->get_type() != PT_TLS ) ) )
                        continue;

                    // Alignment of segment shall not be updated, to preserve original value
                    // It will be re-calculated on saving.
                    seg->add_section_index( psec->get_index(), 0 );
                }
            }
        }

        return true;
    }